

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>>
::emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>,4ul>>
           *this,pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *key)

{
  bool bVar1;
  size_t sVar2;
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_4UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_bool>
  pVar3;
  
  sVar2 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,
                     &key->first);
  current_entry =
       (EntryPointer)
       ((sVar2 * -0x61c8864680b583eb >> ((byte)this[0x18] & 0x3f)) * 0x20 + *(long *)(this + 8));
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar3 = emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>>
                        (this,distance_from_desired,current_entry,key);
      return pVar3;
    }
    bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                      ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,
                       &key->first,&(current_entry->field_1).value.first);
    if (bVar1) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar3._8_8_ = 0;
  pVar3.first.current = current_entry;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }